

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,Pubkey *pubkey)

{
  ByteData local_30;
  
  Pubkey::GetData(&local_30,pubkey);
  ByteData::Push(&this->buffer_,&local_30);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const Pubkey &pubkey) {
  buffer_.Push(pubkey.GetData());
  return *this;
}